

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

float * __thiscall
Gs::Matrix<float,_4UL,_1UL>::operator()(Matrix<float,_4UL,_1UL> *this,size_t row,size_t col)

{
  size_t col_local;
  size_t row_local;
  Matrix<float,_4UL,_1UL> *this_local;
  
  return this[col].m_ + row;
}

Assistant:

const T& operator () (std::size_t row, std::size_t col) const
        {
            GS_ASSERT(row < Rows);
            GS_ASSERT(col < Cols);
            #if GS_ROW_MAJOR_STORAGE
            return m_[row*Cols + col];
            #else
            return m_[col*Rows + row];
            #endif
        }